

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O3

char * cmime_message_generate_message_id(void)

{
  int iVar1;
  char *__name;
  size_t sVar2;
  char *__dest;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  __name = (char *)malloc(0x40);
  gethostname(__name,0x40);
  sVar2 = strlen(__name);
  __dest = (char *)malloc(sVar2 + 0x14);
  bVar3 = true;
  iVar4 = 0;
  while( true ) {
    lVar6 = ((long)iVar4 << 0x20) + 0x100000000;
    lVar5 = 0;
    do {
      iVar1 = cmime_util_rand();
      __dest[lVar5 + iVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[iVar1 % 0x24];
      lVar6 = lVar6 + 0x100000000;
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 8);
    if (!bVar3) break;
    __dest[iVar4 + 8] = '.';
    iVar4 = iVar4 + 9;
    bVar3 = false;
  }
  __dest[iVar4 + 8] = '@';
  __dest[lVar6 >> 0x20] = '\0';
  strcat(__dest,__name);
  free(__name);
  return __dest;
}

Assistant:

char *cmime_message_generate_message_id(void) {
    char *mid = NULL;
    char *hostname = NULL;
    static const char base36[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    int i,i2;
    int pos = 0;

    hostname = (char *)malloc(MAXHOSTNAMELEN);
    gethostname(hostname,MAXHOSTNAMELEN);
        
    mid = (char *)malloc(20 + strlen(hostname));
    for(i=0; i < 2; i++) {
        for (i2=0; i2<8; i2++) 
            mid[pos++] = base36[cmime_util_rand() % 36];
        
        if (i==0)
            mid[pos++] = '.';
        else
            mid[pos++] = '@';
    }
    mid[pos] = '\0';
    strcat(mid,hostname);
    free(hostname);
    return(mid);
}